

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRoundedCone.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChRoundedCone::ArchiveIN(ChRoundedCone *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_60;
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<chrono::ChVector<double>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::geometry::ChRoundedCone>(marchive);
  ChGeometry::ArchiveIN(&this->super_ChGeometry,marchive);
  local_30._value = &this->center;
  local_30._name = "center";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->rad;
  local_48._name = "rad";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->radsphere;
  local_60._name = "radsphere";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  return;
}

Assistant:

void ChRoundedCone::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChRoundedCone>();
    // deserialize parent class
    ChGeometry::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(center);
    marchive >> CHNVP(rad);
    marchive >> CHNVP(radsphere);
}